

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bits.h
# Opt level: O2

Index wasm::Bits::getMaxBits<wasm::OptimizeInstructions>
                (Expression *curr,OptimizeInstructions *localInfoProvider)

{
  undefined4 uVar1;
  undefined4 uVar2;
  int *piVar3;
  bool bVar4;
  BasicType BVar5;
  int32_t iVar6;
  int iVar7;
  uint32_t uVar8;
  Index IVar9;
  Index IVar10;
  uint uVar11;
  Index IVar12;
  int64_t iVar13;
  uint64_t uVar14;
  uint uVar15;
  Expression *pEVar16;
  Literal local_50;
  Index local_34;
  
  local_34 = 0xffffffff;
LAB_008eeb9a:
  while (bVar4 = Properties::emitsBoolean(curr), uVar15 = 1, !bVar4) {
    switch((((Load *)curr)->super_SpecificExpression<(wasm::Expression::Id)12>).super_Expression._id
          ) {
    case LocalGetId:
      if (localInfoProvider == (OptimizeInstructions *)0x0) {
        __assert_fail("localInfoProvider",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                      ,0x1a3,
                      "Index wasm::Bits::getMaxBits(Expression *, LocalInfoProvider *) [LocalInfoProvider = wasm::OptimizeInstructions]"
                     );
      }
      uVar15._0_1_ = ((Load *)curr)->bytes;
      uVar15._1_1_ = ((Load *)curr)->signed_;
      uVar15._2_2_ = *(undefined2 *)&((Load *)curr)->field_0x12;
      uVar15 = (localInfoProvider->localInfo).
               super__Vector_base<wasm::LocalInfo,_std::allocator<wasm::LocalInfo>_>._M_impl.
               super__Vector_impl_data._M_start[uVar15].maxBits;
      goto LAB_008ef0ab;
    case LocalSetId:
      curr = (Expression *)(((Load *)curr)->offset).addr;
      break;
    default:
      goto switchD_008eebbc_caseD_a;
    case LoadId:
      bVar4 = LoadUtils::isSignRelevant((Load *)curr);
      if ((bVar4) && (((Load *)curr)->signed_ == false)) {
        uVar15 = (uint)((Load *)curr)->bytes << 3;
      }
      else {
switchD_008eebbc_caseD_a:
        BVar5 = wasm::Type::getBasic
                          (&(((Load *)curr)->super_SpecificExpression<(wasm::Expression::Id)12>).
                            super_Expression.type);
        if (2 < BVar5 - unreachable) {
          handle_unreachable("invalid type",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                             ,0x1b4);
        }
        uVar15 = *(uint *)(&DAT_00bb91e0 + (ulong)(BVar5 - unreachable) * 4);
      }
      goto LAB_008ef0ab;
    case ConstId:
      BVar5 = wasm::Type::getBasic
                        (&(((Load *)curr)->super_SpecificExpression<(wasm::Expression::Id)12>).
                          super_Expression.type);
      if (BVar5 == i64) {
        Literal::countLeadingZeroes(&local_50,(Literal *)&((Load *)curr)->bytes);
        iVar13 = Literal::geti64(&local_50);
        uVar15 = 0x40 - (int)iVar13;
      }
      else {
        if (BVar5 != i32) {
          handle_unreachable("invalid type",
                             "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                             ,0x8b);
        }
        Literal::countLeadingZeroes(&local_50,(Literal *)&((Load *)curr)->bytes);
        iVar6 = Literal::geti32(&local_50);
        uVar15 = 0x20 - iVar6;
      }
      Literal::~Literal(&local_50);
      goto LAB_008ef0ab;
    case UnaryId:
      uVar2._0_1_ = ((Load *)curr)->bytes;
      uVar2._1_1_ = ((Load *)curr)->signed_;
      uVar2._2_2_ = *(undefined2 *)&((Load *)curr)->field_0x12;
      switch(uVar2) {
      case 0:
      case 2:
      case 4:
        uVar15 = 6;
        break;
      case 1:
      case 3:
      case 5:
        uVar15 = 7;
        break;
      case 6:
      case 7:
      case 8:
      case 9:
      case 10:
      case 0xb:
      case 0xc:
      case 0xd:
      case 0xe:
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
        goto switchD_008eebbc_caseD_a;
      case 0x14:
      case 0x15:
        handle_unreachable("relationals handled before",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                           ,0x182);
      case 0x16:
switchD_008eec11_caseD_16:
        IVar9 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
        bVar4 = IVar9 < 0x20;
        goto LAB_008eed93;
      case 0x17:
      case 0x18:
        uVar15 = getMaxBits<wasm::OptimizeInstructions>
                           ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
        goto LAB_008eed2b;
      default:
        switch(uVar2) {
        case 0x2f:
          IVar9 = getMaxBits<wasm::OptimizeInstructions>
                            ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
          bVar4 = IVar9 < 8;
          goto LAB_008eeda6;
        case 0x30:
          IVar9 = getMaxBits<wasm::OptimizeInstructions>
                            ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
          bVar4 = IVar9 < 0x10;
LAB_008eeda6:
          uVar15 = 0x20;
          goto LAB_008eeda8;
        case 0x31:
          IVar9 = getMaxBits<wasm::OptimizeInstructions>
                            ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
          bVar4 = IVar9 < 8;
          break;
        case 0x32:
          IVar9 = getMaxBits<wasm::OptimizeInstructions>
                            ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
          bVar4 = IVar9 < 0x10;
          break;
        case 0x33:
          goto switchD_008eec11_caseD_16;
        default:
          goto switchD_008eebbc_caseD_a;
        }
LAB_008eed93:
        uVar15 = 0x40;
LAB_008eeda8:
        if (!bVar4) {
          IVar9 = uVar15;
        }
LAB_008eedac:
        if (IVar9 <= local_34) {
          return IVar9;
        }
        return local_34;
      }
      goto LAB_008ef0ab;
    case BinaryId:
      uVar1._0_1_ = ((Load *)curr)->bytes;
      uVar1._1_1_ = ((Load *)curr)->signed_;
      uVar1._2_2_ = *(undefined2 *)&((Load *)curr)->field_0x12;
      switch(uVar1) {
      case 0:
        IVar10 = getMaxBits<wasm::OptimizeInstructions>
                           ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
        IVar9 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)(((Load *)curr)->align).addr,localInfoProvider);
        if (IVar9 < IVar10) {
          IVar9 = IVar10;
        }
        uVar15 = IVar9 + 1;
        goto LAB_008eed2b;
      case 1:
      case 0xd:
      case 0xe:
        break;
      case 2:
        IVar9 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)(((Load *)curr)->align).addr,localInfoProvider);
        IVar10 = getMaxBits<wasm::OptimizeInstructions>
                           ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
        uVar15 = IVar10 + IVar9;
LAB_008eed2b:
        if (local_34 <= uVar15) {
          uVar15 = local_34;
        }
        bVar4 = uVar15 < 0x20;
        IVar9 = 0x20;
LAB_008eed38:
        if (bVar4) {
          return uVar15;
        }
        return IVar9;
      case 3:
        pEVar16 = (Expression *)(((Load *)curr)->align).addr;
        uVar15 = 0x20;
        if ((pEVar16->_id == ConstId) &&
           (IVar9 = getMaxBits<wasm::OptimizeInstructions>
                              ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider),
           IVar9 != 0x20)) {
          iVar6 = Literal::geti32((Literal *)(pEVar16 + 1));
          bVar4 = iVar6 < 0;
          goto LAB_008ef116;
        }
        goto LAB_008ef0ab;
      case 4:
      case 0x1d:
        uVar15 = getMaxBits<wasm::OptimizeInstructions>
                           ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
        pEVar16 = (Expression *)(((Load *)curr)->align).addr;
        if (pEVar16->_id == ConstId) {
          IVar9 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                            (pEVar16,(DummyLocalInfoProvider *)0x0);
          iVar7 = -1;
          if (-1 < (int)(uVar15 - IVar9)) {
            iVar7 = uVar15 - IVar9;
          }
          uVar15 = iVar7 + 1;
        }
        goto LAB_008ef0ab;
      case 5:
        piVar3 = (int *)(((Load *)curr)->align).addr;
        uVar15 = 0x20;
        if ((*piVar3 == 0xe) &&
           (IVar10 = getMaxBits<wasm::OptimizeInstructions>
                               ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider),
           IVar9 = local_34, IVar10 != 0x20)) {
          uVar8 = Literal::geti32((Literal *)(piVar3 + 4));
          uVar11 = ceilLog2(uVar8);
          local_34 = IVar9;
          goto LAB_008eef0a;
        }
        goto LAB_008ef0ab;
      case 6:
        piVar3 = (int *)(((Load *)curr)->align).addr;
        if (*piVar3 == 0xe) {
          uVar15 = getMaxBits<wasm::OptimizeInstructions>
                             ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
          uVar8 = Literal::geti32((Literal *)(piVar3 + 4));
          uVar11 = ceilLog2(uVar8);
LAB_008ef09d:
          bVar4 = uVar11 < uVar15;
LAB_008ef09f:
          if (bVar4) {
            uVar15 = uVar11;
          }
          goto LAB_008ef0ab;
        }
        break;
      case 7:
        goto switchD_008eebd6_caseD_7;
      case 8:
      case 9:
      case 0x21:
      case 0x22:
        IVar10 = getMaxBits<wasm::OptimizeInstructions>
                           ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
        IVar9 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)(((Load *)curr)->align).addr,localInfoProvider);
        if (IVar9 < IVar10) {
          IVar9 = IVar10;
        }
        goto LAB_008eedac;
      case 10:
        pEVar16 = (Expression *)(((Load *)curr)->align).addr;
        if (pEVar16->_id == ConstId) {
          IVar9 = getMaxBits<wasm::OptimizeInstructions>
                            ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
          IVar10 = getEffectiveShifts(pEVar16);
          uVar11 = IVar10 + IVar9;
          bVar4 = uVar11 < 0x20;
          uVar15 = 0x20;
          goto LAB_008ef09f;
        }
        break;
      case 0xb:
        pEVar16 = (Expression *)(((Load *)curr)->align).addr;
        uVar15 = 0x20;
        if (pEVar16->_id == ConstId) {
          uVar11 = getMaxBits<wasm::OptimizeInstructions>
                             ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
          bVar4 = uVar11 == 0x20;
          goto LAB_008ef01a;
        }
        goto LAB_008ef0ab;
      case 0xc:
        pEVar16 = (Expression *)(((Load *)curr)->align).addr;
        if (pEVar16->_id == ConstId) {
LAB_008eefa6:
          IVar9 = getMaxBits<wasm::OptimizeInstructions>
                            ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
          IVar10 = getEffectiveShifts(pEVar16);
          uVar15 = IVar9 - IVar10;
          bVar4 = uVar15 == 0;
          if (IVar9 < IVar10) {
            uVar15 = 0;
          }
          if (IVar9 < IVar10 || bVar4) {
            uVar15 = 0;
          }
          goto LAB_008ef0ab;
        }
        break;
      case 0xf:
      case 0x10:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
      case 0x15:
      case 0x16:
      case 0x17:
      case 0x18:
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2b:
      case 0x2c:
      case 0x2d:
      case 0x2e:
      case 0x2f:
      case 0x30:
      case 0x31:
      case 0x39:
      case 0x3a:
      case 0x3b:
      case 0x3c:
      case 0x3d:
      case 0x3e:
      case 0x46:
      case 0x47:
      case 0x48:
      case 0x49:
      case 0x4a:
      case 0x4b:
        handle_unreachable("relationals handled before",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/bits.h"
                           ,0x172);
      case 0x19:
        IVar10 = getMaxBits<wasm::OptimizeInstructions>
                           ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
        IVar9 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)(((Load *)curr)->align).addr,localInfoProvider);
        if (IVar9 < IVar10) {
          IVar9 = IVar10;
        }
        uVar15 = IVar9 + 1;
        goto LAB_008ef153;
      case 0x1a:
      case 0x26:
      case 0x27:
        goto switchD_008eebd6_caseD_1a;
      case 0x1b:
        IVar9 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)(((Load *)curr)->align).addr,localInfoProvider);
        IVar10 = getMaxBits<wasm::OptimizeInstructions>
                           ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
        uVar15 = IVar10 + IVar9;
LAB_008ef153:
        if (local_34 <= uVar15) {
          uVar15 = local_34;
        }
        bVar4 = uVar15 < 0x40;
        IVar9 = 0x40;
        goto LAB_008eed38;
      case 0x1c:
        pEVar16 = (Expression *)(((Load *)curr)->align).addr;
        uVar15 = 0x40;
        if ((pEVar16->_id == ConstId) &&
           (IVar9 = getMaxBits<wasm::OptimizeInstructions>
                              ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider),
           IVar9 != 0x40)) {
          iVar13 = Literal::geti64((Literal *)(pEVar16 + 1));
          bVar4 = iVar13 < 0;
LAB_008ef116:
          IVar10 = local_34;
          local_34 = IVar10;
          if (!bVar4) {
            IVar12 = getMaxBits<wasm::Bits::DummyLocalInfoProvider>
                               (pEVar16,(DummyLocalInfoProvider *)0x0);
            iVar7 = -1;
            if (-1 < (int)(IVar9 - IVar12)) {
              iVar7 = IVar9 - IVar12;
            }
            local_34 = IVar10;
            uVar15 = iVar7 + 1;
          }
        }
        goto LAB_008ef0ab;
      case 0x1e:
        piVar3 = (int *)(((Load *)curr)->align).addr;
        uVar15 = 0x40;
        if ((*piVar3 == 0xe) &&
           (IVar10 = getMaxBits<wasm::OptimizeInstructions>
                               ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider),
           IVar9 = local_34, IVar10 != 0x40)) {
          uVar14 = Literal::geti64((Literal *)(piVar3 + 4));
          uVar11 = ceilLog2(uVar14);
          local_34 = IVar9;
LAB_008eef0a:
          uVar15 = IVar10;
          if (uVar11 < IVar10) {
            uVar15 = uVar11;
          }
        }
        goto LAB_008ef0ab;
      case 0x1f:
        piVar3 = (int *)(((Load *)curr)->align).addr;
        if (*piVar3 == 0xe) {
          uVar15 = getMaxBits<wasm::OptimizeInstructions>
                             ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
          uVar14 = Literal::geti64((Literal *)(piVar3 + 4));
          uVar11 = ceilLog2(uVar14);
          goto LAB_008ef09d;
        }
        goto switchD_008eebd6_caseD_1a;
      case 0x20:
        IVar10 = getMaxBits<wasm::OptimizeInstructions>
                           ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
        IVar9 = getMaxBits<wasm::OptimizeInstructions>
                          ((Expression *)(((Load *)curr)->align).addr,localInfoProvider);
        if (IVar10 <= IVar9) {
          IVar9 = IVar10;
        }
        goto LAB_008eedac;
      case 0x23:
        pEVar16 = (Expression *)(((Load *)curr)->align).addr;
        if (pEVar16->_id == ConstId) {
          IVar9 = getMaxBits<wasm::OptimizeInstructions>
                            ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
          IVar10 = getEffectiveShifts(pEVar16);
          uVar11 = IVar10 + IVar9;
          bVar4 = uVar11 < 0x40;
          uVar15 = 0x40;
          goto LAB_008ef09f;
        }
        goto switchD_008eebd6_caseD_1a;
      case 0x24:
        pEVar16 = (Expression *)(((Load *)curr)->align).addr;
        uVar15 = 0x40;
        if (pEVar16->_id == ConstId) {
          uVar11 = getMaxBits<wasm::OptimizeInstructions>
                             ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
          bVar4 = uVar11 == 0x40;
LAB_008ef01a:
          IVar9 = local_34;
          local_34 = IVar9;
          if (!bVar4) {
            IVar10 = getEffectiveShifts(pEVar16);
            uVar15 = uVar11 - IVar10;
            bVar4 = uVar15 == 0;
            if (uVar11 < IVar10) {
              uVar15 = 0;
            }
            local_34 = IVar9;
            if (uVar11 < IVar10 || bVar4) {
              uVar15 = 0;
            }
          }
        }
        goto LAB_008ef0ab;
      case 0x25:
        pEVar16 = (Expression *)(((Load *)curr)->align).addr;
        if (pEVar16->_id == ConstId) goto LAB_008eefa6;
switchD_008eebd6_caseD_1a:
        uVar15 = 0x40;
        goto LAB_008ef0ab;
      default:
        goto switchD_008eebbc_caseD_a;
      }
      uVar15 = 0x20;
      goto LAB_008ef0ab;
    }
  }
LAB_008ef0ab:
  if (local_34 < uVar15) {
    uVar15 = local_34;
  }
  return uVar15;
switchD_008eebd6_caseD_7:
  IVar9 = getMaxBits<wasm::OptimizeInstructions>
                    ((Expression *)(((Load *)curr)->offset).addr,localInfoProvider);
  curr = (Expression *)(((Load *)curr)->align).addr;
  if (IVar9 <= local_34) {
    local_34 = IVar9;
  }
  goto LAB_008eeb9a;
}

Assistant:

Index getMaxBits(Expression* curr,
                 LocalInfoProvider* localInfoProvider = nullptr) {
  if (Properties::emitsBoolean(curr)) {
    return 1;
  }
  if (auto* c = curr->dynCast<Const>()) {
    switch (curr->type.getBasic()) {
      case Type::i32:
        return 32 - c->value.countLeadingZeroes().geti32();
      case Type::i64:
        return 64 - c->value.countLeadingZeroes().geti64();
      default:
        WASM_UNREACHABLE("invalid type");
    }
  } else if (auto* binary = curr->dynCast<Binary>()) {
    switch (binary->op) {
      // 32-bit
      case RotLInt32:
      case RotRInt32:
      case SubInt32:
        return 32;
      case AddInt32: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(32), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt32: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(32), maxBitsLeft + maxBitsRight);
      }
      case DivSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // If either side might be negative, then the result will be negative
          if (maxBitsLeft == 32 || c->value.geti32() < 0) {
            return 32;
          }
          int32_t bitsRight = getMaxBits(c);
          return std::max(0, maxBitsLeft - bitsRight + 1);
        }
        return 32;
      }
      case DivUInt32: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          return std::max(0, maxBitsLeft - bitsRight + 1);
        }
        return maxBitsLeft;
      }
      case RemSInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 32) {
            return 32;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case RemUInt32: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti32()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 32;
      }
      case AndInt32: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt32:
      case XorInt32: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt32: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          return std::min(Index(32),
                          getMaxBits(binary->left, localInfoProvider) +
                            Bits::getEffectiveShifts(shifts));
        }
        return 32;
      }
      case ShrUInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case ShrSInt32: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 32) {
            return 32;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 32;
      }
      case RotLInt64:
      case RotRInt64:
      case SubInt64:
        return 64;
      case AddInt64: {
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        return std::min(Index(64), std::max(maxBitsLeft, maxBitsRight) + 1);
      }
      case MulInt64: {
        auto maxBitsRight = getMaxBits(binary->right, localInfoProvider);
        auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        return std::min(Index(64), maxBitsLeft + maxBitsRight);
      }
      case DivSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left or right const value is negative
          if (maxBitsLeft == 64 || c->value.geti64() < 0) {
            return 64;
          }
          int32_t bitsRight = getMaxBits(c);
          return std::max(0, maxBitsLeft - bitsRight + 1);
        }
        return 64;
      }
      case DivUInt64: {
        int32_t maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
        if (auto* c = binary->right->dynCast<Const>()) {
          int32_t bitsRight = getMaxBits(c);
          return std::max(0, maxBitsLeft - bitsRight + 1);
        }
        return maxBitsLeft;
      }
      case RemSInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBitsLeft == 64) {
            return 64;
          }
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case RemUInt64: {
        if (auto* c = binary->right->dynCast<Const>()) {
          auto maxBitsLeft = getMaxBits(binary->left, localInfoProvider);
          auto bitsRight = Index(ceilLog2(c->value.geti64()));
          return std::min(maxBitsLeft, bitsRight);
        }
        return 64;
      }
      case AndInt64: {
        return std::min(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case OrInt64:
      case XorInt64: {
        return std::max(getMaxBits(binary->left, localInfoProvider),
                        getMaxBits(binary->right, localInfoProvider));
      }
      case ShlInt64: {
        if (auto* shifts = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          return std::min(Index(64),
                          Bits::getEffectiveShifts(shifts) + maxBits);
        }
        return 64;
      }
      case ShrUInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      case ShrSInt64: {
        if (auto* shift = binary->right->dynCast<Const>()) {
          auto maxBits = getMaxBits(binary->left, localInfoProvider);
          // if left may be negative, the result may be negative
          if (maxBits == 64) {
            return 64;
          }
          auto shifts =
            std::min(Index(Bits::getEffectiveShifts(shift)),
                     maxBits); // can ignore more shifts than zero us out
          return std::max(Index(0), maxBits - shifts);
        }
        return 64;
      }
      // comparisons
      case EqInt32:
      case NeInt32:
      case LtSInt32:
      case LtUInt32:
      case LeSInt32:
      case LeUInt32:
      case GtSInt32:
      case GtUInt32:
      case GeSInt32:
      case GeUInt32:

      case EqInt64:
      case NeInt64:
      case LtSInt64:
      case LtUInt64:
      case LeSInt64:
      case LeUInt64:
      case GtSInt64:
      case GtUInt64:
      case GeSInt64:
      case GeUInt64:

      case EqFloat32:
      case NeFloat32:
      case LtFloat32:
      case LeFloat32:
      case GtFloat32:
      case GeFloat32:

      case EqFloat64:
      case NeFloat64:
      case LtFloat64:
      case LeFloat64:
      case GtFloat64:
      case GeFloat64:
        WASM_UNREACHABLE("relationals handled before");
      default: {
      }
    }
  } else if (auto* unary = curr->dynCast<Unary>()) {
    switch (unary->op) {
      case ClzInt32:
      case CtzInt32:
      case PopcntInt32:
        return 6;
      case ClzInt64:
      case CtzInt64:
      case PopcntInt64:
        return 7;
      case EqZInt32:
      case EqZInt64:
        WASM_UNREACHABLE("relationals handled before");
      case WrapInt64:
      case ExtendUInt32:
        return std::min(Index(32), getMaxBits(unary->value, localInfoProvider));
      case ExtendS8Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(32) : maxBits;
      }
      case ExtendS16Int32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(32) : maxBits;
      }
      case ExtendS8Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 8 ? Index(64) : maxBits;
      }
      case ExtendS16Int64: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 16 ? Index(64) : maxBits;
      }
      case ExtendS32Int64:
      case ExtendSInt32: {
        auto maxBits = getMaxBits(unary->value, localInfoProvider);
        return maxBits >= 32 ? Index(64) : maxBits;
      }
      default: {
      }
    }
  } else if (auto* set = curr->dynCast<LocalSet>()) {
    // a tee passes through the value
    return getMaxBits(set->value, localInfoProvider);
  } else if (auto* get = curr->dynCast<LocalGet>()) {
    // TODO: Should this be optional?
    assert(localInfoProvider);
    return localInfoProvider->getMaxBitsForLocal(get);
  } else if (auto* load = curr->dynCast<Load>()) {
    // if signed, then the sign-extension might fill all the bits
    // if unsigned, then we have a limit
    if (LoadUtils::isSignRelevant(load) && !load->signed_) {
      return 8 * load->bytes;
    }
  }
  switch (curr->type.getBasic()) {
    case Type::i32:
      return 32;
    case Type::i64:
      return 64;
    case Type::unreachable:
      return 64; // not interesting, but don't crash
    default:
      WASM_UNREACHABLE("invalid type");
  }
}